

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

Value * __thiscall Json::Value::operator[](Value *this,ArrayIndex index)

{
  ushort uVar1;
  ValueHolder VVar2;
  _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  int iVar3;
  iterator iVar4;
  _Base_ptr p_Var5;
  CZString key;
  value_type defaultValue;
  ValueHolder local_68;
  int local_60;
  ValueHolder local_50;
  ushort local_48;
  Value local_40;
  
  if (this->field_0x8 == '\0') {
    Value((Value *)&local_68,arrayValue);
    Value((Value *)&local_50,(Value *)&local_68);
    uVar1 = *(ushort *)&this->field_0x8;
    VVar2 = this->value_;
    this->value_ = local_50;
    *(ushort *)&this->field_0x8 = local_48 & 0x1ff | uVar1 & 0xfe00;
    local_48 = uVar1 & 0x1ff | local_48 & 0xfe00;
    local_50 = VVar2;
    ~Value((Value *)&local_50);
    ~Value((Value *)&local_68);
  }
  else if (this->field_0x8 != '\x06') {
    __assert_fail("type_ == nullValue || type_ == arrayValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/jsoncpp/src/lib_json/json_value.cpp"
                  ,0x435,"Value &Json::Value::operator[](ArrayIndex)");
  }
  CZString::CZString((CZString *)&local_68,index);
  this_00 = &((this->value_).map_)->_M_t;
  iVar4 = std::
          _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
          ::_M_lower_bound(this_00,(_Link_type)
                                   (this_00->_M_impl).super__Rb_tree_header._M_header._M_parent,
                           &(this_00->_M_impl).super__Rb_tree_header._M_header,(CZString *)&local_68
                          );
  if ((_Rb_tree_header *)iVar4._M_node !=
      &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header) {
    p_Var5 = iVar4._M_node + 1;
    if (*(char **)(iVar4._M_node + 1) == (char *)0x0) {
      if (*(int *)&iVar4._M_node[1]._M_parent == local_60) goto LAB_00147c77;
    }
    else {
      iVar3 = strcmp(*(char **)(iVar4._M_node + 1),local_68.string_);
      if (iVar3 == 0) goto LAB_00147c77;
    }
  }
  CZString::CZString((CZString *)&local_50,(CZString *)&local_68);
  Value(&local_40,(Value *)null);
  iVar4 = std::
          _Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
          ::_M_emplace_hint_unique<std::pair<Json::Value::CZString_const,Json::Value>&>
                    ((_Rb_tree<Json::Value::CZString,std::pair<Json::Value::CZString_const,Json::Value>,std::_Select1st<std::pair<Json::Value::CZString_const,Json::Value>>,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                      *)(this->value_).map_,iVar4._M_node,
                     (pair<const_Json::Value::CZString,_Json::Value> *)&local_50);
  p_Var5 = iVar4._M_node + 1;
  ~Value(&local_40);
  CZString::~CZString((CZString *)&local_50);
LAB_00147c77:
  CZString::~CZString((CZString *)&local_68);
  return (Value *)&p_Var5->_M_left;
}

Assistant:

Value &
Value::operator[]( ArrayIndex index )
{
   JSON_ASSERT( type_ == nullValue  ||  type_ == arrayValue );
   if ( type_ == nullValue )
      *this = Value( arrayValue );
#ifndef JSON_VALUE_USE_INTERNAL_MAP
   CZString key( index );
   ObjectValues::iterator it = value_.map_->lower_bound( key );
   if ( it != value_.map_->end()  &&  (*it).first == key )
      return (*it).second;

   ObjectValues::value_type defaultValue( key, null );
   it = value_.map_->insert( it, defaultValue );
   return (*it).second;
#else
   return value_.array_->resolveReference( index );
#endif
}